

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::ReportLastSystemError(char *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  undefined1 local_30 [8];
  string m;
  char *msg_local;
  
  m.field_2._8_8_ = msg;
  cmAlphaNum::cmAlphaNum(&local_60,msg);
  cmAlphaNum::cmAlphaNum(&local_90,": System Error: ");
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  cmStrCat<std::__cxx11::string>((string *)local_30,&local_60,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  Error((string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m =
    cmStrCat(msg, ": System Error: ", Superclass::GetLastSystemError());
  cmSystemTools::Error(m);
}